

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(UdpSocket_*,_void_*)> * __thiscall
UdpSocket::BindFuncBytesReceived
          (function<void_(UdpSocket_*,_void_*)> *__return_storage_ptr__,UdpSocket *this,
          function<void_(UdpSocket_*,_void_*)> *fBytesReceived)

{
  BaseSocketImpl *pBVar1;
  long *local_68;
  function<void_(UdpSocket_*,_void_*)> local_40;
  function<void_(UdpSocket_*,_void_*)> *local_20;
  function<void_(UdpSocket_*,_void_*)> *fBytesReceived_local;
  UdpSocket *this_local;
  
  local_20 = fBytesReceived;
  fBytesReceived_local = (function<void_(UdpSocket_*,_void_*)> *)this;
  this_local = (UdpSocket *)__return_storage_ptr__;
  pBVar1 = BaseSocket::GetImpl(&this->super_BaseSocket);
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    local_68 = (long *)0x0;
  }
  else {
    local_68 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&UdpSocketImpl::typeinfo,0);
  }
  std::function<void_(UdpSocket_*,_void_*)>::function(&local_40,fBytesReceived);
  (**(code **)(*local_68 + 0xd0))(__return_storage_ptr__,local_68,&local_40);
  std::function<void_(UdpSocket_*,_void_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(UdpSocket*, void*)> UdpSocket::BindFuncBytesReceived(std::function<void(UdpSocket*, void*)> fBytesReceived)
{
    return dynamic_cast<UdpSocketImpl*>(GetImpl())->BindFuncBytesReceived(fBytesReceived);
}